

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_test.cpp
# Opt level: O3

void __thiscall RGBSpectrum_RoundTripsRGB_Test::TestBody(RGBSpectrum_RoundTripsRGB_Test *this)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  RGBColorSpace *cs;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar5;
  bool bVar6;
  uint64_t oldstate;
  ulong uVar7;
  long lVar8;
  byte bVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  char *pcVar13;
  long lVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar23 [56];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar24 [16];
  undefined1 in_ZMM3 [64];
  undefined1 in_register_00001304 [12];
  XYZ XVar25;
  RGB RVar26;
  Float eps;
  AssertionResult gtest_ar;
  DenselySampledSpectrum rsIllum;
  RGBReflectanceSpectrum rs;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  string local_108;
  float local_e4;
  internal local_e0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  RGB local_d0;
  RGB local_c0;
  float local_b4;
  undefined8 local_b0;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_a8;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_88;
  SpectrumHandle local_80;
  XYZ local_78;
  undefined1 local_68 [16];
  RGBReflectanceSpectrum local_4c;
  
  cs = pbrt::RGBColorSpace::sRGB;
  iVar15 = 0;
  local_88.bits = (ulong)&local_b0 | 0x2000000000000;
  uVar7 = 0x853c49e6748fea9b;
  do {
    uVar10 = uVar7 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
    uVar11 = uVar10 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
    uVar12 = (uint)(uVar11 >> 0x2d) ^ (uint)(uVar11 >> 0x1b);
    bVar9 = (byte)(uVar11 >> 0x3b);
    auVar20 = vcvtusi2ss_avx512f(in_ZMM3._0_16_,uVar12 >> bVar9 | uVar12 << 0x20 - bVar9);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar10;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar7;
    auVar19 = vpunpcklqdq_avx(auVar24,auVar19);
    auVar17 = vpsrlvq_avx2(auVar19,_DAT_006015a0);
    auVar24 = vpsrlvq_avx2(auVar19,_DAT_006015b0);
    in_ZMM3 = ZEXT1664(auVar24);
    auVar19 = vpsrlq_avx(auVar19,0x3b);
    auVar16 = vpshufd_avx(auVar19,0xe8);
    auVar19 = vminss_avx(ZEXT416((uint)(auVar20._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
    auVar17 = vpshufd_avx(auVar17 ^ auVar24,0xe8);
    auVar16 = vprorvd_avx512vl(auVar17,auVar16);
    auVar17 = vcvtudq2ps_avx512vl(auVar16);
    auVar16._8_4_ = 0x2f800000;
    auVar16._0_8_ = 0x2f8000002f800000;
    auVar16._12_4_ = 0x2f800000;
    auVar16 = vmulps_avx512vl(auVar17,auVar16);
    auVar17._8_4_ = 0x3f7fffff;
    auVar17._0_8_ = 0x3f7fffff3f7fffff;
    auVar17._12_4_ = 0x3f7fffff;
    auVar16 = vminps_avx512vl(auVar16,auVar17);
    local_d0._0_8_ = vmovlps_avx(auVar16);
    local_d0.b = auVar19._0_4_;
    pbrt::RGBReflectanceSpectrum::RGBReflectanceSpectrum(&local_4c,cs,&local_d0);
    local_a8.alloc.memoryResource = pstd::pmr::new_delete_resource();
    local_b0 = 0x33e00000168;
    local_a8.ptr = (float *)0x0;
    local_a8.nAlloc = 0;
    local_a8.nStored = 0;
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::reserve(&local_a8,0x1d7);
    memset(local_a8.ptr,0,0x75c);
    lVar14 = 0;
    local_a8.nStored = 0x1d7;
    do {
      auVar20._0_4_ = (float)((int)lVar14 + 0x168);
      auVar20._4_12_ = in_register_00001304;
      local_b4 = local_4c.scale;
      auVar19 = vfmadd213ss_fma(ZEXT416((uint)local_4c.rsp.c0),auVar20,
                                ZEXT416((uint)local_4c.rsp.c1));
      auVar19 = vfmadd213ss_fma(auVar19,auVar20,ZEXT416((uint)local_4c.rsp.c2));
      if (ABS(auVar19._0_4_) == INFINITY) {
        uVar1 = vcmpss_avx512f(auVar19,ZEXT416(0),0xe);
        fVar18 = (float)((uint)((byte)uVar1 & 1) * 0x3f800000);
      }
      else {
        auVar16 = vfmadd213ss_fma(auVar19,auVar19,ZEXT416(0x3f800000));
        auVar16 = vsqrtss_avx(auVar16,auVar16);
        fVar18 = auVar19._0_4_ / (auVar16._0_4_ + auVar16._0_4_) + 0.5;
      }
      local_68 = ZEXT416((uint)fVar18);
      lVar8 = lroundf(auVar20._0_4_);
      uVar12 = (int)lVar8 - (cs->illuminant).lambda_min;
      fVar18 = 0.0;
      if ((-1 < (int)uVar12) && ((ulong)uVar12 < (cs->illuminant).values.nStored)) {
        fVar18 = (cs->illuminant).values.ptr[uVar12];
      }
      auVar23 = (undefined1  [56])0x0;
      local_a8.ptr[lVar14] = (float)local_68._0_4_ * local_b4 * fVar18;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0x1d7);
    local_80.
    super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
    .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
             )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
               )local_88.bits;
    XVar25 = pbrt::SpectrumToXYZ(&local_80);
    local_78.Z = XVar25.Z;
    auVar21._0_8_ = XVar25._0_8_;
    auVar21._8_56_ = auVar23;
    local_78._0_8_ = vmovlps_avx(auVar21._0_16_);
    RVar26 = pbrt::RGBColorSpace::ToRGB(cs,&local_78);
    local_c0.b = RVar26.b;
    auVar22._0_8_ = RVar26._0_8_;
    auVar22._8_56_ = auVar23;
    local_c0._0_8_ = vmovlps_avx(auVar22._0_16_);
    local_e4 = 0.01;
    auVar2._8_4_ = 0x7fffffff;
    auVar2._0_8_ = 0x7fffffff7fffffff;
    auVar2._12_4_ = 0x7fffffff;
    auVar19 = vandps_avx512vl(ZEXT416((uint)(local_d0.r - RVar26.r)),auVar2);
    local_108._M_dataplus._M_p._0_4_ = auVar19._0_4_;
    testing::internal::CmpHelperLT<float,float>
              (local_e0,"std::abs(rgb.r - rgb2.r)","eps",(float *)&local_108,&local_e4);
    if (local_e0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_110);
      sVar5.ptr_ = local_110.ptr_;
      pbrt::RGB::ToString_abi_cxx11_(&local_108,&local_d0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(sVar5.ptr_ + 0x10),
                 (char *)CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_)
                 ,local_108._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_) !=
          &local_108.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_),
                        local_108.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_110.ptr_ + 0x10)," vs ",4);
      sVar5.ptr_ = local_110.ptr_;
      pbrt::RGB::ToString_abi_cxx11_(&local_108,&local_c0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(sVar5.ptr_ + 0x10),
                 (char *)CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_)
                 ,local_108._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_) !=
          &local_108.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_),
                        local_108.field_2._M_allocated_capacity + 1);
      }
      pcVar13 = "";
      if (local_d8.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar13 = ((local_d8.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/color_test.cpp"
                 ,0x75,pcVar13);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
      if (local_110.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar6 = testing::internal::IsTrue(true);
        if ((bVar6) &&
           (local_110.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_110.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    auVar3._8_4_ = 0x7fffffff;
    auVar3._0_8_ = 0x7fffffff7fffffff;
    auVar3._12_4_ = 0x7fffffff;
    auVar19 = vandps_avx512vl(ZEXT416((uint)(local_d0.g - local_c0.g)),auVar3);
    local_108._M_dataplus._M_p._0_4_ = auVar19._0_4_;
    testing::internal::CmpHelperLT<float,float>
              (local_e0,"std::abs(rgb.g - rgb2.g)","eps",(float *)&local_108,&local_e4);
    if (local_e0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_110);
      sVar5.ptr_ = local_110.ptr_;
      pbrt::RGB::ToString_abi_cxx11_(&local_108,&local_d0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(sVar5.ptr_ + 0x10),
                 (char *)CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_)
                 ,local_108._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_) !=
          &local_108.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_),
                        local_108.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_110.ptr_ + 0x10)," vs ",4);
      sVar5.ptr_ = local_110.ptr_;
      pbrt::RGB::ToString_abi_cxx11_(&local_108,&local_c0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(sVar5.ptr_ + 0x10),
                 (char *)CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_)
                 ,local_108._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_) !=
          &local_108.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_),
                        local_108.field_2._M_allocated_capacity + 1);
      }
      pcVar13 = "";
      if (local_d8.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar13 = ((local_d8.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/color_test.cpp"
                 ,0x76,pcVar13);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
      if (local_110.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar6 = testing::internal::IsTrue(true);
        if ((bVar6) &&
           (local_110.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_110.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    auVar4._8_4_ = 0x7fffffff;
    auVar4._0_8_ = 0x7fffffff7fffffff;
    auVar4._12_4_ = 0x7fffffff;
    auVar19 = vandps_avx512vl(ZEXT416((uint)(local_d0.b - local_c0.b)),auVar4);
    local_108._M_dataplus._M_p._0_4_ = auVar19._0_4_;
    testing::internal::CmpHelperLT<float,float>
              (local_e0,"std::abs(rgb.b - rgb2.b)","eps",(float *)&local_108,&local_e4);
    if (local_e0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_110);
      sVar5.ptr_ = local_110.ptr_;
      pbrt::RGB::ToString_abi_cxx11_(&local_108,&local_d0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(sVar5.ptr_ + 0x10),
                 (char *)CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_)
                 ,local_108._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_) !=
          &local_108.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_),
                        local_108.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_110.ptr_ + 0x10)," vs ",4);
      sVar5.ptr_ = local_110.ptr_;
      pbrt::RGB::ToString_abi_cxx11_(&local_108,&local_c0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(sVar5.ptr_ + 0x10),
                 (char *)CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_)
                 ,local_108._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_) !=
          &local_108.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_108._M_dataplus._M_p._4_4_,local_108._M_dataplus._M_p._0_4_),
                        local_108.field_2._M_allocated_capacity + 1);
      }
      pcVar13 = "";
      if (local_d8.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar13 = ((local_d8.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/color_test.cpp"
                 ,0x77,pcVar13);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
      if (local_110.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar6 = testing::internal::IsTrue(true);
        if ((bVar6) &&
           (local_110.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_110.ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_a8.nStored = 0;
    (*(local_a8.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_a8.alloc.memoryResource,local_a8.ptr,local_a8.nAlloc << 2,4);
    uVar7 = uVar11 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
    iVar15 = iVar15 + 1;
  } while (iVar15 != 100);
  return;
}

Assistant:

TEST(RGBSpectrum, RoundTripsRGB) {
    RNG rng;
    const RGBColorSpace &cs = *RGBColorSpace::sRGB;

    for (int i = 0; i < 100; ++i) {
        RGB rgb(rng.Uniform<Float>(), rng.Uniform<Float>(), rng.Uniform<Float>());
        RGBReflectanceSpectrum rs(cs, rgb);

        DenselySampledSpectrum rsIllum = DenselySampledSpectrum::SampleFunction(
            [&](Float lambda) { return rs(lambda) * cs.illuminant(lambda); });
        XYZ xyz = SpectrumToXYZ(&rsIllum);
        RGB rgb2 = cs.ToRGB(xyz);

        // Some error comes from the fact that piecewise linear (at 5nm)
        // CIE curves were used for the optimization while we use piecewise
        // linear at 1nm spacing converted to 1nm constant / densely
        // sampled.
        Float eps = .01;
        EXPECT_LT(std::abs(rgb.r - rgb2.r), eps) << rgb << " vs " << rgb2;
        EXPECT_LT(std::abs(rgb.g - rgb2.g), eps) << rgb << " vs " << rgb2;
        EXPECT_LT(std::abs(rgb.b - rgb2.b), eps) << rgb << " vs " << rgb2;
    }
}